

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O2

void skiwi::compile_string_hash(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t in_RDX;
  uint64_t lab;
  uint64_t lab_00;
  operand local_88;
  operand local_84;
  operand local_80 [2];
  string repeat;
  string done;
  string error;
  
  psVar1 = label;
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_(&repeat,psVar1,in_RDX);
    std::__cxx11::string::operator=((string *)&error,(string *)&repeat);
    std::__cxx11::string::~string((string *)&repeat);
    repeat._M_dataplus._M_p._0_4_ = 5;
    done._M_dataplus._M_p._0_4_ = 0x14;
    local_88 = NUMBER;
    local_84 = AL;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&repeat,(operand *)&done,&local_88,(int *)&local_84);
    repeat._M_dataplus._M_p._0_4_ = 0x34;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&repeat,&error);
    jump_if_arg_is_not_block(code,RCX,R11,&error);
  }
  done._M_dataplus._M_p._0_4_ = 2;
  local_88 = RCX;
  local_84 = NUMBER;
  repeat._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,(operation *)&done,&local_88,&local_84,(unsigned_long *)&repeat);
  if (ops->safe_primitives == true) {
    jump_if_arg_does_not_point_to_string(code,RCX,R11,&error);
  }
  repeat._M_dataplus._M_p._0_4_ = 0x4b;
  done._M_dataplus._M_p._0_4_ = 10;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&repeat,(operand *)&done);
  repeat._M_dataplus._M_p._0_4_ = 0x4b;
  done._M_dataplus._M_p._0_4_ = 0xc;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&repeat,(operand *)&done);
  repeat._M_dataplus._M_p._0_4_ = 0x40;
  done._M_dataplus._M_p._0_4_ = 0x14;
  local_88 = MEM_RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&repeat,(operand *)&done,&local_88);
  done._M_dataplus._M_p._0_4_ = 0x40;
  local_88 = RAX;
  local_84 = NUMBER;
  repeat._M_dataplus._M_p = (pointer)0xffffffffffffff;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,long>
            (code,(operation *)&done,&local_88,&local_84,(long *)&repeat);
  repeat._M_dataplus._M_p._0_4_ = 2;
  done._M_dataplus._M_p._0_4_ = 0x14;
  local_88 = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&repeat,(operand *)&done,&local_88);
  repeat._M_dataplus._M_p = repeat._M_dataplus._M_p & 0xffffffff00000000;
  done._M_dataplus._M_p._0_4_ = 0xb;
  local_88 = NUMBER;
  local_84 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&repeat,(operand *)&done,&local_88,(int *)&local_84);
  repeat._M_dataplus._M_p._0_4_ = 0x40;
  done._M_dataplus._M_p._0_4_ = 9;
  local_88 = MEM_RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&repeat,(operand *)&done,&local_88);
  repeat._M_dataplus._M_p = repeat._M_dataplus._M_p & 0xffffffff00000000;
  done._M_dataplus._M_p._0_4_ = 0xb;
  local_88 = NUMBER;
  local_84 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&repeat,(operand *)&done,&local_88,(int *)&local_84);
  repeat._M_dataplus._M_p._0_4_ = 0xd;
  done._M_dataplus._M_p._0_4_ = 0x14;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&repeat,(operand *)&done);
  done._M_dataplus._M_p._0_4_ = 0x40;
  local_88 = R15;
  local_84 = NUMBER;
  repeat._M_dataplus._M_p = (pointer)0xd088016b;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,long>
            (code,(operation *)&done,&local_88,&local_84,(long *)&repeat);
  repeat._M_dataplus._M_p._0_4_ = 0x45;
  done._M_dataplus._M_p._0_4_ = 0x18;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&repeat,(operand *)&done);
  repeat._M_dataplus._M_p._0_4_ = 0x40;
  done._M_dataplus._M_p._0_4_ = 10;
  local_88 = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&repeat,(operand *)&done,&local_88);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&repeat,psVar1,lab);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&done,psVar1,lab_00);
  local_88 = ST4;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,&local_88,&repeat);
  local_88 = XMM13|RBX;
  local_84 = R11;
  local_80[0] = local_84;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_88,&local_84,local_80);
  local_88 = BYTE_MEM_R15;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>(code,&local_88,&done)
  ;
  local_88 = ST6;
  local_84 = RAX;
  local_80[0] = MEM_RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_88,&local_84,local_80);
  local_88 = XMM2;
  local_84 = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_88,&local_84);
  local_88 = XMM13|RDX;
  local_84 = RBX;
  local_80[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_88,&local_84,local_80);
  local_88 = RSI;
  local_84 = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_88,&local_84);
  local_88 = EMPTY;
  local_84 = RCX;
  local_80[0] = NUMBER;
  local_80[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_88,&local_84,local_80,(int *)(local_80 + 1));
  local_88 = BYTE_MEM_R12;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,&local_88,&repeat);
  local_88 = ST4;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>(code,&local_88,&done)
  ;
  local_88 = ST6;
  local_84 = RAX;
  local_80[0] = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_88,&local_84,local_80);
  local_88 = XMM13|CH;
  local_84 = RBX;
  local_80[0] = NUMBER;
  local_80[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_88,&local_84,local_80,(int *)(local_80 + 1));
  local_88 = XMM13|RDX;
  local_84 = RAX;
  local_80[0] = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_88,&local_84,local_80);
  local_88 = XMM13|CH;
  local_84 = RBX;
  local_80[0] = NUMBER;
  local_80[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_88,&local_84,local_80,(int *)(local_80 + 1));
  local_88 = XMM13|RDX;
  local_84 = RAX;
  local_80[0] = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_88,&local_84,local_80);
  local_88 = XMM13|CH;
  local_84 = RBX;
  local_80[0] = NUMBER;
  local_80[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_88,&local_84,local_80,(int *)(local_80 + 1));
  local_88 = XMM13|RDX;
  local_84 = RAX;
  local_80[0] = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_88,&local_84,local_80);
  local_88 = XMM13|CH;
  local_84 = RBX;
  local_80[0] = NUMBER;
  local_80[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_88,&local_84,local_80,(int *)(local_80 + 1));
  local_88 = XMM13|RDX;
  local_84 = RAX;
  local_80[0] = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_88,&local_84,local_80);
  local_88 = XMM13|CH;
  local_84 = RBX;
  local_80[0] = NUMBER;
  local_80[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_88,&local_84,local_80,(int *)(local_80 + 1));
  local_88 = XMM13|RDX;
  local_84 = RAX;
  local_80[0] = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_88,&local_84,local_80);
  local_88 = XMM13|CH;
  local_84 = RBX;
  local_80[0] = NUMBER;
  local_80[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_88,&local_84,local_80,(int *)(local_80 + 1));
  local_88 = XMM13|RDX;
  local_84 = RAX;
  local_80[0] = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_88,&local_84,local_80);
  local_88 = XMM13|CH;
  local_84 = RBX;
  local_80[0] = NUMBER;
  local_80[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_88,&local_84,local_80,(int *)(local_80 + 1));
  local_88 = XMM13|RDX;
  local_84 = RAX;
  local_80[0] = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_88,&local_84,local_80);
  local_88 = AH;
  local_84 = RAX;
  local_80[0] = NUMBER;
  local_80[1] = 0xff;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_88,&local_84,local_80,(int *)(local_80 + 1));
  local_88 = XMM13|CL;
  local_84 = RAX;
  local_80[0] = NUMBER;
  local_80[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_88,&local_84,local_80,(int *)(local_80 + 1));
  local_88 = XMM7;
  local_84 = RDX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_88,&local_84);
  local_88 = XMM7;
  local_84 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_88,&local_84);
  local_88 = BYTE_MEM_RDX;
  local_84 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_88,&local_84);
  if (ops->safe_primitives == true) {
    error_label(code,&error,re_string_hash_contract_violation);
  }
  std::__cxx11::string::~string((string *)&done);
  std::__cxx11::string::~string((string *)&repeat);
  std::__cxx11::string::~string((string *)&error);
  return;
}

Assistant:

void compile_string_hash(asmcode& code, const compiler_options& ops)
  {

  std::string error;
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 1);
    code.add(asmcode::JNE, error);
    jump_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xfffffffffffffff8);
  if (ops.safe_primitives)
    {
    jump_if_arg_does_not_point_to_string(code, asmcode::RCX, asmcode::R11, error);
    }

  code.add(asmcode::PUSH, asmcode::RBX);
  code.add(asmcode::PUSH, asmcode::RDX);
  code.add(asmcode::MOV, asmcode::R11, asmcode::MEM_RCX);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, block_size_mask);
  code.add(asmcode::AND, asmcode::R11, asmcode::RAX);
  code.add(asmcode::ADD, asmcode::RCX, asmcode::NUMBER, CELLS(1));

  code.add(asmcode::MOV, asmcode::RAX, asmcode::MEM_RCX);
  code.add(asmcode::ADD, asmcode::RCX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::DEC, asmcode::R11);
  code.add(asmcode::MOV, asmcode::R15, asmcode::NUMBER, 3498574187);
  code.add(asmcode::MUL, asmcode::R15);
  code.add(asmcode::MOV, asmcode::RBX, asmcode::RAX);

  auto repeat = label_to_string(label++);
  auto done = label_to_string(label++);

  code.add(asmcode::LABEL, repeat);
  code.add(asmcode::TEST, asmcode::R11, asmcode::R11);
  code.add(asmcode::JES, done);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::MEM_RCX);
  code.add(asmcode::MUL, asmcode::R15);
  code.add(asmcode::XOR, asmcode::RBX, asmcode::RAX);
  code.add(asmcode::DEC, asmcode::R11);
  code.add(asmcode::ADD, asmcode::RCX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::JMPS, repeat);
  code.add(asmcode::LABEL, done);

  code.add(asmcode::MOV, asmcode::RAX, asmcode::RBX);
  code.add(asmcode::SHR, asmcode::RBX, asmcode::NUMBER, 8);
  code.add(asmcode::XOR, asmcode::RAX, asmcode::RBX);
  code.add(asmcode::SHR, asmcode::RBX, asmcode::NUMBER, 8);
  code.add(asmcode::XOR, asmcode::RAX, asmcode::RBX);
  code.add(asmcode::SHR, asmcode::RBX, asmcode::NUMBER, 8);
  code.add(asmcode::XOR, asmcode::RAX, asmcode::RBX);
  code.add(asmcode::SHR, asmcode::RBX, asmcode::NUMBER, 8);
  code.add(asmcode::XOR, asmcode::RAX, asmcode::RBX);
  code.add(asmcode::SHR, asmcode::RBX, asmcode::NUMBER, 8);
  code.add(asmcode::XOR, asmcode::RAX, asmcode::RBX);
  code.add(asmcode::SHR, asmcode::RBX, asmcode::NUMBER, 8);
  code.add(asmcode::XOR, asmcode::RAX, asmcode::RBX);
  code.add(asmcode::SHR, asmcode::RBX, asmcode::NUMBER, 8);
  code.add(asmcode::XOR, asmcode::RAX, asmcode::RBX);
  code.add(asmcode::AND, asmcode::RAX, asmcode::NUMBER, 255);
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 1);
  code.add(asmcode::POP, asmcode::RDX);
  code.add(asmcode::POP, asmcode::RBX);
  code.add(asmcode::JMP, CONTINUE);

  if (ops.safe_primitives)
    {
    error_label(code, error, re_string_hash_contract_violation);
    }
  }